

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O3

int IsRegister(char *zeexpression)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  char cVar5;
  bool bVar6;
  
  cVar1 = *zeexpression;
  if (cVar1 != '\0') {
    pcVar3 = zeexpression + 1;
    uVar4 = 0x12345678;
    cVar5 = cVar1;
    do {
      uVar4 = uVar4 + (int)cVar5 ^ uVar4 << 9;
      cVar5 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar5 != '\0');
    bVar6 = false;
    if ((int)uVar4 < 0x4bd5311b) {
      if ((int)uVar4 < 0x4bd5071c) {
        if ((int)uVar4 < -0x1e60e89b) {
          if (uVar4 == 0xe19f1162) {
            pcVar3 = "IYH";
          }
          else if (uVar4 == 0xe19f1166) {
            pcVar3 = "IYL";
          }
          else {
            if (uVar4 != 0xe19f1761) goto switchD_001130e2_caseD_7a98a6bf;
            pcVar3 = "IXH";
          }
LAB_001132ab:
          iVar2 = strcmp(zeexpression,pcVar3);
          bVar6 = iVar2 == 0;
          goto switchD_001130e2_caseD_7a98a6bf;
        }
        if ((int)uVar4 < 0x4bd5051d) {
          if (uVar4 == 0xe19f1765) {
            pcVar3 = "IXL";
            goto LAB_001132ab;
          }
          if (uVar4 != 0x4bd50519) goto switchD_001130e2_caseD_7a98a6bf;
          if (cVar1 == 'Y') {
LAB_001131ef:
            if (zeexpression[1] == 'H') goto LAB_001132e0;
          }
        }
        else if (uVar4 == 0x4bd5051d) {
          if (cVar1 == 'Y') goto LAB_001132b9;
        }
        else {
          if (uVar4 != 0x4bd50718) goto switchD_001130e2_caseD_7a98a6bf;
          if (cVar1 == 'X') goto LAB_001131ef;
        }
      }
      else if ((int)uVar4 < 0x4bd52718) {
        if ((int)uVar4 < 0x4bd5251a) {
          if (uVar4 == 0x4bd5071c) {
            if (cVar1 == 'X') {
LAB_001132b9:
              if (zeexpression[1] == 'L') goto LAB_001132e0;
            }
          }
          else {
            if (uVar4 != 0x4bd52519) goto switchD_001130e2_caseD_7a98a6bf;
            if (cVar1 == 'I') goto LAB_001132da;
          }
        }
        else if (uVar4 == 0x4bd5251a) {
          if (cVar1 == 'I') goto LAB_001132cd;
        }
        else {
          if (uVar4 != 0x4bd5270c) goto switchD_001130e2_caseD_7a98a6bf;
          if (cVar1 == 'H') goto LAB_001132b9;
        }
      }
      else if ((int)uVar4 < 0x4bd52f1c) {
        if (uVar4 == 0x4bd52718) {
          if (cVar1 == 'H') {
LAB_001132da:
            if (zeexpression[1] == 'X') goto LAB_001132e0;
          }
        }
        else {
          if (uVar4 != 0x4bd52719) goto switchD_001130e2_caseD_7a98a6bf;
          if (cVar1 == 'H') {
LAB_001132cd:
            if (zeexpression[1] == 'Y') goto LAB_001132e0;
          }
        }
      }
      else if (uVar4 == 0x4bd52f1c) {
        if (cVar1 == 'L') goto LAB_001132da;
      }
      else {
        if (uVar4 != 0x4bd52f1d) goto switchD_001130e2_caseD_7a98a6bf;
        if (cVar1 == 'L') goto LAB_001132cd;
      }
    }
    else if ((int)uVar4 < 0x4bd5df01) {
      if (uVar4 == 0x4bd5311b) {
        if ((cVar1 == 'S') && (zeexpression[1] == 'P')) {
LAB_001132e0:
          bVar6 = zeexpression[2] == '\0';
          goto switchD_001130e2_caseD_7a98a6bf;
        }
      }
      else if (uVar4 == 0x4bd5d2fd) {
        if ((cVar1 == 'B') && (zeexpression[1] == 'C')) goto LAB_001132e0;
      }
      else {
        if (uVar4 != 0x4bd5d4ff) goto switchD_001130e2_caseD_7a98a6bf;
        if ((cVar1 == 'A') && (zeexpression[1] == 'F')) goto LAB_001132e0;
      }
    }
    else {
      switch(uVar4) {
      case 0x7a98a6b9:
        if (cVar1 == 'A') {
LAB_001132eb:
          bVar6 = zeexpression[1] == '\0';
          goto switchD_001130e2_caseD_7a98a6bf;
        }
        break;
      case 0x7a98a6ba:
        if (cVar1 == 'B') goto LAB_001132eb;
        break;
      case 0x7a98a6bb:
        if (cVar1 == 'C') goto LAB_001132eb;
        break;
      case 0x7a98a6bc:
        if (cVar1 == 'D') goto LAB_001132eb;
        break;
      case 0x7a98a6bd:
        if (cVar1 == 'E') goto LAB_001132eb;
        break;
      case 0x7a98a6be:
        if (cVar1 == 'F') goto LAB_001132eb;
        break;
      case 0x7a98a6bf:
      case 0x7a98a6c2:
      case 0x7a98a6c3:
      case 0x7a98a6c5:
      case 0x7a98a6c6:
      case 0x7a98a6c7:
      case 0x7a98a6c8:
      case 0x7a98a6c9:
        goto switchD_001130e2_caseD_7a98a6bf;
      case 0x7a98a6c0:
        if (cVar1 == 'H') goto LAB_001132eb;
        break;
      case 0x7a98a6c1:
        if (cVar1 == 'I') goto LAB_001132eb;
        break;
      case 0x7a98a6c4:
        if (cVar1 == 'L') goto LAB_001132eb;
        break;
      case 0x7a98a6ca:
        if (cVar1 == 'R') goto LAB_001132eb;
        break;
      default:
        if (uVar4 != 0x4bd5df01) goto switchD_001130e2_caseD_7a98a6bf;
        if ((cVar1 == 'D') && (zeexpression[1] == 'E')) goto LAB_001132e0;
      }
    }
  }
  bVar6 = false;
switchD_001130e2_caseD_7a98a6bf:
  return (int)bVar6;
}

Assistant:

int IsRegister(char *zeexpression)
{
	#undef FUNC
	#define FUNC "IsRegister"

	switch (GetCRC(zeexpression)) {
		case CRC_F:if (strcmp(zeexpression,"F")==0) return 1; else return 0;
		case CRC_I:if (strcmp(zeexpression,"I")==0) return 1; else return 0;
		case CRC_R:if (strcmp(zeexpression,"R")==0) return 1; else return 0;
		case CRC_A:if (strcmp(zeexpression,"A")==0) return 1; else return 0;
		case CRC_B:if (strcmp(zeexpression,"B")==0) return 1; else return 0;
		case CRC_C:if (strcmp(zeexpression,"C")==0) return 1; else return 0;
		case CRC_D:if (strcmp(zeexpression,"D")==0) return 1; else return 0;
		case CRC_E:if (strcmp(zeexpression,"E")==0) return 1; else return 0;
		case CRC_H:if (strcmp(zeexpression,"H")==0) return 1; else return 0;
		case CRC_L:if (strcmp(zeexpression,"L")==0) return 1; else return 0;
		case CRC_BC:if (strcmp(zeexpression,"BC")==0) return 1; else return 0;
		case CRC_DE:if (strcmp(zeexpression,"DE")==0) return 1; else return 0;
		case CRC_HL:if (strcmp(zeexpression,"HL")==0) return 1; else return 0;
		case CRC_IX:if (strcmp(zeexpression,"IX")==0) return 1; else return 0;
		case CRC_IY:if (strcmp(zeexpression,"IY")==0) return 1; else return 0;
		case CRC_SP:if (strcmp(zeexpression,"SP")==0) return 1; else return 0;
		case CRC_AF:if (strcmp(zeexpression,"AF")==0) return 1; else return 0;
		case CRC_XH:if (strcmp(zeexpression,"XH")==0) return 1; else return 0;
		case CRC_XL:if (strcmp(zeexpression,"XL")==0) return 1; else return 0;
		case CRC_YH:if (strcmp(zeexpression,"YH")==0) return 1; else return 0;
		case CRC_YL:if (strcmp(zeexpression,"YL")==0) return 1; else return 0;
		case CRC_HX:if (strcmp(zeexpression,"HX")==0) return 1; else return 0;
		case CRC_LX:if (strcmp(zeexpression,"LX")==0) return 1; else return 0;
		case CRC_HY:if (strcmp(zeexpression,"HY")==0) return 1; else return 0;
		case CRC_LY:if (strcmp(zeexpression,"LY")==0) return 1; else return 0;
		case CRC_IXL:if (strcmp(zeexpression,"IXL")==0) return 1; else return 0;
		case CRC_IXH:if (strcmp(zeexpression,"IXH")==0) return 1; else return 0;
		case CRC_IYL:if (strcmp(zeexpression,"IYL")==0) return 1; else return 0;
		case CRC_IYH:if (strcmp(zeexpression,"IYH")==0) return 1; else return 0;
		default:break;
	}
	return 0;
}